

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O3

void fill(int64_t *dst,int size,int type)

{
  int64_t iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __nmemb;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar2 = _DAT_0011b280;
  switch(type) {
  case 0:
    if (size != 0) {
      uVar5 = 0;
      do {
        lVar4 = lrand48();
        dst[uVar5] = lVar4;
        uVar5 = uVar5 + 1;
      } while ((uint)size != uVar5);
    }
    break;
  case 1:
    fill_dup50(dst,size);
    return;
  case 2:
    if (size != 0) {
      uVar5 = 0;
      do {
        lVar4 = lrand48();
        dst[uVar5] = (ulong)((uint)lVar4 & 1);
        uVar5 = uVar5 + 1;
      } while ((uint)size != uVar5);
    }
    break;
  case 3:
    if (size != 0) {
      uVar5 = 0;
      do {
        lVar4 = lrand48();
        dst[uVar5] = lVar4 % 10;
        uVar5 = uVar5 + 1;
      } while ((uint)size != uVar5);
    }
    break;
  case 4:
    if (size != 0) {
      uVar5 = 0;
      do {
        lVar4 = lrand48();
        dst[uVar5] = lVar4;
        uVar5 = uVar5 + 1;
      } while ((uint)size != uVar5);
    }
    goto LAB_0010bd5b;
  case 5:
    fill_dup50(dst,size);
    goto LAB_0010bd5b;
  case 6:
    if (size != 0) {
      uVar5 = 0;
      do {
        lVar4 = lrand48();
        dst[uVar5] = (ulong)((uint)lVar4 & 1);
        uVar5 = uVar5 + 1;
      } while ((uint)size != uVar5);
    }
    goto LAB_0010bd5b;
  case 7:
    if (size != 0) {
      uVar5 = 0;
      do {
        lVar4 = lrand48();
        dst[uVar5] = lVar4 % 10;
        uVar5 = uVar5 + 1;
      } while ((uint)size != uVar5);
    }
LAB_0010bd5b:
    __nmemb = (ulong)(uint)size / 6;
    qsort(dst,(ulong)((uint)size >> 1),8,simple_cmp);
    dst = dst + ((uint)size >> 1);
LAB_0010bd99:
    qsort(dst,__nmemb,8,simple_cmp_reverse);
    return;
  case 8:
    if (size != 0) {
      lVar4 = (ulong)(uint)size - 1;
      auVar11._8_4_ = (int)lVar4;
      auVar11._0_8_ = lVar4;
      auVar11._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar5 = 0;
      auVar11 = auVar11 ^ _DAT_0011b280;
      auVar14 = _DAT_0011b270;
      do {
        auVar17 = auVar14 ^ auVar2;
        if ((bool)(~(auVar17._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar17._0_4_ ||
                    auVar11._4_4_ < auVar17._4_4_) & 1)) {
          dst[uVar5] = uVar5;
        }
        if ((auVar17._12_4_ != auVar11._12_4_ || auVar17._8_4_ <= auVar11._8_4_) &&
            auVar17._12_4_ <= auVar11._12_4_) {
          dst[uVar5 + 1] = uVar5 + 1;
        }
        uVar5 = uVar5 + 2;
        lVar4 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar4 + 2;
      } while (((ulong)(uint)size + 1 & 0xfffffffffffffffe) != uVar5);
    }
    break;
  case 9:
    if (size == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(uint)size;
      lVar4 = uVar5 - 1;
      auVar9._8_4_ = (int)lVar4;
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar3 = 0;
      auVar9 = auVar9 ^ _DAT_0011b280;
      auVar13 = _DAT_0011b270;
      do {
        auVar17 = auVar13 ^ auVar2;
        if ((bool)(~(auVar17._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar17._0_4_ ||
                    auVar9._4_4_ < auVar17._4_4_) & 1)) {
          dst[uVar3] = uVar3;
        }
        if ((auVar17._12_4_ != auVar9._12_4_ || auVar17._8_4_ <= auVar9._8_4_) &&
            auVar17._12_4_ <= auVar9._12_4_) {
          dst[uVar3 + 1] = uVar3 + 1;
        }
        uVar3 = uVar3 + 2;
        lVar4 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar4 + 2;
      } while ((uVar5 + 1 & 0xfffffffffffffffe) != uVar3);
    }
    uVar3 = *dst;
    iVar6 = ((uint)size >> 4) + 1;
    do {
      uVar3 = uVar3 * 0x5851f42d4c957f2d + 1;
      uVar7 = (uVar3 >> 0x1d) % uVar5;
      uVar3 = uVar3 * 0x5851f42d4c957f2d + 1;
      uVar8 = (uVar3 >> 0x1d) % uVar5;
      iVar1 = dst[uVar7];
      dst[uVar7] = dst[uVar8];
      dst[uVar8] = iVar1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    break;
  case 10:
    if (size != 0) {
      uVar5 = (ulong)(uint)size;
      lVar4 = 0;
      do {
        dst[uVar5 & 0xffffffff] = lVar4;
        lVar4 = lVar4 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    break;
  case 0xb:
    if (size != 0) {
      uVar5 = 0;
      do {
        lVar4 = lrand48();
        dst[uVar5] = (ulong)((uint)lVar4 & 1);
        uVar5 = uVar5 + 1;
      } while ((uint)size != uVar5);
    }
    goto LAB_0010baa1;
  case 0xc:
    if (size != 0) {
      uVar5 = 0;
      do {
        lVar4 = lrand48();
        dst[uVar5] = lVar4 % 10;
        uVar5 = uVar5 + 1;
      } while ((uint)size != uVar5);
    }
LAB_0010baa1:
    __nmemb = (size_t)size;
    goto LAB_0010bd99;
  case 0xd:
    if (size != 0) {
      memset(dst,0,(ulong)(uint)size << 3);
      return;
    }
    break;
  case 0xe:
    iVar6 = 10;
    goto LAB_0010bb8d;
  case 0xf:
    iVar6 = 100;
    goto LAB_0010bb8d;
  case 0x10:
    iVar6 = 10000;
LAB_0010bb8d:
    fill_sorted_blocks(dst,size,iVar6);
    return;
  case 0x11:
    iVar6 = size / 2;
    goto LAB_0010bdb5;
  case 0x12:
    iVar6 = size + 7;
    if (-1 < size) {
      iVar6 = size;
    }
    iVar6 = iVar6 >> 3;
LAB_0010bdb5:
    fill_swapped(dst,size,iVar6);
    return;
  case 0x13:
    if (size != 0) {
      lVar4 = (ulong)(uint)size - 1;
      auVar12._8_4_ = (int)lVar4;
      auVar12._0_8_ = lVar4;
      auVar12._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar5 = 0;
      auVar12 = auVar12 ^ _DAT_0011b280;
      auVar16 = _DAT_0011b270;
      do {
        auVar17 = auVar16 ^ auVar2;
        if ((bool)(~(auVar17._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar17._0_4_ ||
                    auVar12._4_4_ < auVar17._4_4_) & 1)) {
          dst[uVar5] = uVar5 + 1;
        }
        if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
            auVar17._12_4_ <= auVar12._12_4_) {
          dst[uVar5 + 1] = uVar5;
        }
        uVar5 = uVar5 + 2;
        lVar4 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 2;
        auVar16._8_8_ = lVar4 + 2;
      } while (((ulong)(uint)size + 1 & 0xfffffffffffffffe) != uVar5);
    }
    break;
  case 0x14:
    if (size != 0) {
      uVar5 = (ulong)(uint)size;
      lVar4 = uVar5 - 1;
      auVar10._8_4_ = (int)lVar4;
      auVar10._0_8_ = lVar4;
      auVar10._12_4_ = (int)((ulong)lVar4 >> 0x20);
      lVar4 = 1;
      auVar10 = auVar10 ^ _DAT_0011b280;
      auVar17 = _DAT_0011b270;
      do {
        auVar16 = auVar17 ^ auVar2;
        if ((bool)(~(auVar16._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar16._0_4_ ||
                    auVar10._4_4_ < auVar16._4_4_) & 1)) {
          dst[lVar4 + -1] = (ulong)(uint)size;
        }
        if ((auVar16._12_4_ != auVar10._12_4_ || auVar16._8_4_ <= auVar10._8_4_) &&
            auVar16._12_4_ <= auVar10._12_4_) {
          dst[lVar4] = lVar4;
        }
        lVar15 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 2;
        auVar17._8_8_ = lVar15 + 2;
        lVar15 = lVar4 - (uVar5 + 1 & 0xfffffffffffffffe);
        lVar4 = lVar4 + 2;
        size = size - 2;
      } while (lVar15 != -1);
    }
    break;
  default:
    abort();
  }
  return;
}

Assistant:

static void fill(int64_t *dst, const int size, int type) {
  switch (type) {
  case FILL_RANDOM:
    fill_random(dst, size);
    break;

  case FILL_RNDDUP50:
    fill_dup50(dst, size);
    break;

  case FILL_RANDOM2:
    fill_random2(dst, size);
    break;

  case FILL_RANDOM10:
    fill_random10(dst, size);
    break;

  case FILL_MIXED:
    fill_random(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_MIXDUP50:
    fill_dup50(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_MIXED2:
    fill_random2(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_MIXED10:
    fill_random10(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_SORTED:
    fill_sorted(dst, size);
    break;

  case FILL_SORTED94:
    fill_sorted(dst, size);
    make_disord6(dst, size);
    break;

  case FILL_REVERSE:
    fill_reverse(dst, size);
    break;

  case FILL_REVERSE2:
    fill_random2(dst, size);
    qsort(dst, size, sizeof(int64_t), simple_cmp_reverse);
    break;

  case FILL_REVERSE10:
    fill_random10(dst, size);
    qsort(dst, size, sizeof(int64_t), simple_cmp_reverse);
    break;

  case FILL_ALLSAME:
    fill_same(dst, size);
    break;

  case FILL_SORTED_10:
    fill_sorted_blocks(dst, size, 10);
    break;

  case FILL_SORTED_100:
    fill_sorted_blocks(dst, size, 100);
    break;

  case FILL_SORTED_10000:
    fill_sorted_blocks(dst, size, 10000);
    break;

  case FILL_SWAPPED_N2:
    fill_swapped(dst, size, size / 2);
    break;

  case FILL_SWAPPED_N8:
    fill_swapped(dst, size, size / 8);
    break;

  case FILL_EVIL1:
    for (unsigned i = 0; i < size; i++)
      dst[i] = i ^ 1;
    break;

  case FILL_EVIL2:
    for (unsigned i = 0; i < size; i++)
      dst[i] = (i & 1) ? i : size - i;
    break;

  default:
    abort();
  }
}